

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

int get_physical_address_wtlb
              (CPUPPCState_conflict2 *env,mmu_ctx_t_conflict *ctx,target_ulong eaddr,int rw,
              int access_type,int mmu_idx)

{
  CPUState *pCVar1;
  bool bVar2;
  int local_30;
  _Bool real_mode;
  int ret;
  int mmu_idx_local;
  int access_type_local;
  int rw_local;
  target_ulong eaddr_local;
  mmu_ctx_t_conflict *ctx_local;
  CPUPPCState_conflict2 *env_local;
  
  local_30 = -1;
  if (((access_type != 0x10) || (bVar2 = true, (env->msr >> 5 & 1) != 0)) &&
     (bVar2 = false, access_type != 0x10)) {
    bVar2 = (env->msr >> 4 & 1) == 0;
  }
  switch(env->mmu_model) {
  case POWERPC_MMU_SOFT_6xx:
  case POWERPC_MMU_SOFT_74xx:
    if (bVar2) {
      local_30 = check_physical(env,ctx,eaddr,rw);
    }
    else {
      if (env->nb_BATs != 0) {
        local_30 = get_bat_6xx_tlb(env,ctx,eaddr,rw,access_type);
      }
      if (local_30 < 0) {
        local_30 = get_segment_6xx_tlb(env,ctx,eaddr,rw,access_type);
      }
    }
    break;
  case POWERPC_MMU_SOFT_4xx:
  case POWERPC_MMU_SOFT_4xx_Z:
    if (bVar2) {
      local_30 = check_physical(env,ctx,eaddr,rw);
    }
    else {
      local_30 = mmu40x_get_physical_address(env,ctx,eaddr,rw,access_type);
    }
    break;
  case POWERPC_MMU_REAL:
    if (!bVar2) {
      pCVar1 = env_cpu(env);
      cpu_abort_ppc64(pCVar1,"PowerPC in real mode do not do any translation\n");
    }
    local_30 = check_physical(env,ctx,eaddr,rw);
    break;
  case POWERPC_MMU_MPC8xx:
    pCVar1 = env_cpu(env);
    cpu_abort_ppc64(pCVar1,"MPC8xx MMU model is not implemented\n");
  case POWERPC_MMU_BOOKE:
    local_30 = mmubooke_get_physical_address(env,ctx,eaddr,rw,access_type);
    break;
  case POWERPC_MMU_BOOKE206:
    local_30 = mmubooke206_get_physical_address(env,ctx,eaddr,rw,access_type,mmu_idx);
    break;
  default:
    pCVar1 = env_cpu(env);
    cpu_abort_ppc64(pCVar1,"Unknown or invalid MMU model\n");
  }
  return local_30;
}

Assistant:

static int get_physical_address_wtlb(
    CPUPPCState *env, mmu_ctx_t *ctx,
    target_ulong eaddr, int rw, int access_type,
    int mmu_idx)
{
    int ret = -1;
    bool real_mode = (access_type == ACCESS_CODE && msr_ir == 0)
        || (access_type != ACCESS_CODE && msr_dr == 0);

    switch (env->mmu_model) {
    case POWERPC_MMU_SOFT_6xx:
    case POWERPC_MMU_SOFT_74xx:
        if (real_mode) {
            ret = check_physical(env, ctx, eaddr, rw);
        } else {
            /* Try to find a BAT */
            if (env->nb_BATs != 0) {
                ret = get_bat_6xx_tlb(env, ctx, eaddr, rw, access_type);
            }
            if (ret < 0) {
                /* We didn't match any BAT entry or don't have BATs */
                ret = get_segment_6xx_tlb(env, ctx, eaddr, rw, access_type);
            }
        }
        break;

    case POWERPC_MMU_SOFT_4xx:
    case POWERPC_MMU_SOFT_4xx_Z:
        if (real_mode) {
            ret = check_physical(env, ctx, eaddr, rw);
        } else {
            ret = mmu40x_get_physical_address(env, ctx, eaddr,
                                              rw, access_type);
        }
        break;
    case POWERPC_MMU_BOOKE:
        ret = mmubooke_get_physical_address(env, ctx, eaddr,
                                            rw, access_type);
        break;
    case POWERPC_MMU_BOOKE206:
        ret = mmubooke206_get_physical_address(env, ctx, eaddr, rw,
                                               access_type, mmu_idx);
        break;
    case POWERPC_MMU_MPC8xx:
        /* XXX: TODO */
        cpu_abort(env_cpu(env), "MPC8xx MMU model is not implemented\n");
        break;
    case POWERPC_MMU_REAL:
        if (real_mode) {
            ret = check_physical(env, ctx, eaddr, rw);
        } else {
            cpu_abort(env_cpu(env),
                      "PowerPC in real mode do not do any translation\n");
            return -1;
        }
        break;
    default:
        cpu_abort(env_cpu(env), "Unknown or invalid MMU model\n");
        return -1;
    }

    return ret;
}